

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

double __thiscall ON_BinaryArchive::Internal_ArchiveModelSpaceTextScale(ON_BinaryArchive *this)

{
  bool bVar1;
  double local_38;
  double local_30;
  double model_space_text_scale;
  double default_model_space_text_scale;
  ON_BinaryArchive *this_local;
  
  if ((this->m_archive_3dm_settings == (ON_3dmSettings *)0x0) ||
     (bVar1 = ON_3dmAnnotationSettings::Is_V5_AnnotationScalingEnabled
                        (&this->m_archive_3dm_settings->m_AnnotationSettings), !bVar1)) {
    local_30 = 1.0;
  }
  else {
    local_30 = ON_3dmAnnotationSettings::WorldViewTextScale
                         (&this->m_archive_3dm_settings->m_AnnotationSettings);
  }
  if ((local_30 <= 0.0) || (bVar1 = ON_IsValid(local_30), !bVar1)) {
    local_38 = 1.0;
  }
  else {
    local_38 = local_30;
  }
  return local_38;
}

Assistant:

double ON_BinaryArchive::Internal_ArchiveModelSpaceTextScale() const
{
  const double default_model_space_text_scale = 1.0;

  const double model_space_text_scale
    = (nullptr != m_archive_3dm_settings && m_archive_3dm_settings->m_AnnotationSettings.Is_V5_AnnotationScalingEnabled())
    ? m_archive_3dm_settings->m_AnnotationSettings.WorldViewTextScale()
    : default_model_space_text_scale;

  return (model_space_text_scale > 0.0 && ON_IsValid(model_space_text_scale)) ? model_space_text_scale : default_model_space_text_scale;
}